

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

floatx80 normalizeRoundAndPackFloatx80
                   (int8 roundingPrecision,flag zSign,int32 zExp,bits64 zSig0,bits64 zSig1)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  bits64 a;
  floatx80 fVar4;
  
  uVar3 = zSig1;
  a = zSig0;
  if (zSig0 == 0) {
    uVar3 = 0;
    a = zSig1;
  }
  bVar1 = countLeadingZeros64(a);
  if (bVar1 != 0) {
    a = a << (bVar1 & 0x3f) | uVar3 >> (-bVar1 & 0x3f);
  }
  iVar2 = zExp + -0x40;
  if (zSig0 != 0) {
    iVar2 = zExp;
  }
  fVar4 = roundAndPackFloatx80
                    (roundingPrecision,zSign,iVar2 - (char)bVar1,a,uVar3 << (bVar1 & 0x3f));
  return fVar4;
}

Assistant:

static floatx80
	normalizeRoundAndPackFloatx80(
		int8 roundingPrecision, flag zSign, int32 zExp, bits64 zSig0, bits64 zSig1
	)
{
	int8 shiftCount;

	if ( zSig0 == 0 ) {
		zSig0 = zSig1;
		zSig1 = 0;
		zExp -= 64;
	}
	shiftCount = countLeadingZeros64( zSig0 );
	shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
	zExp -= shiftCount;
	return
		roundAndPackFloatx80( roundingPrecision, zSign, zExp, zSig0, zSig1 );

}